

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

DWORD * __thiscall MIDIStreamer::WriteStopNotes(MIDIStreamer *this,DWORD *events)

{
  DWORD DVar1;
  
  DVar1 = 0x79b0;
  do {
    events[0] = 0;
    events[1] = 0;
    events[2] = DVar1 + 0x200;
    events[3] = 0;
    events[4] = 0;
    events[5] = DVar1;
    events = events + 6;
    DVar1 = DVar1 + 1;
  } while (DVar1 != 0x79c0);
  return events;
}

Assistant:

DWORD *MIDIStreamer::WriteStopNotes(DWORD *events)
{
	for (int i = 0; i < 16; ++i)
	{
		events[0] = 0;				// dwDeltaTime
		events[1] = 0;				// dwStreamID
		events[2] = MIDI_CTRLCHANGE | i | (123 << 8);	// All notes off
		events[3] = 0;
		events[4] = 0;
		events[5] = MIDI_CTRLCHANGE | i | (121 << 8);	// Reset controllers
		events += 6;
	}
	return events;
}